

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# omptarget.cpp
# Opt level: O3

int target_data_end(DeviceTy *Device,int32_t arg_num,void **args_base,void **args,int64_t *arg_sizes
                   ,int64_t *arg_types)

{
  ulong uVar1;
  undefined8 *puVar2;
  ulong uVar3;
  undefined8 *puVar4;
  byte bVar5;
  int32_t iVar6;
  int iVar7;
  long lVar8;
  void *TgtPtrBegin;
  iterator __position;
  uint uVar9;
  undefined8 *HstPtrBegin;
  byte bVar10;
  ulong uVar11;
  bool bVar12;
  bool IsLast;
  bool local_81;
  DeviceTy *local_80;
  int64_t *local_78;
  int64_t local_70;
  pthread_mutex_t *local_68;
  void **local_60;
  _Base_ptr local_58;
  void *local_50;
  ulong local_48;
  int64_t *local_40;
  _Rb_tree<void*,std::pair<void*const,ShadowPtrValTy>,std::_Select1st<std::pair<void*const,ShadowPtrValTy>>,std::less<void*>,std::allocator<std::pair<void*const,ShadowPtrValTy>>>
  *local_38;
  
  if (0 < arg_num) {
    local_68 = (pthread_mutex_t *)&Device->ShadowMtx;
    local_38 = (_Rb_tree<void*,std::pair<void*const,ShadowPtrValTy>,std::_Select1st<std::pair<void*const,ShadowPtrValTy>>,std::less<void*>,std::allocator<std::pair<void*const,ShadowPtrValTy>>>
                *)&Device->ShadowPtrMap;
    local_58 = &(Device->ShadowPtrMap)._M_t._M_impl.super__Rb_tree_header._M_header;
    local_48 = (ulong)(uint)arg_num;
    uVar11 = local_48;
    local_80 = Device;
    local_78 = arg_types;
    local_60 = args;
    local_40 = arg_sizes;
    do {
      uVar1 = uVar11 - 1;
      uVar3 = local_78[uVar11 - 1];
      uVar9 = (uint)uVar3;
      if ((uVar3 & 0x180) == 0) {
        HstPtrBegin = (undefined8 *)local_60[uVar1];
        local_70 = local_40[uVar1];
        if ((((long)uVar11 < (long)local_48 && uVar3 < 0x1000000000000) &&
            (uVar11 == *(ushort *)((long)local_78 + uVar11 * 8 + 6))) &&
           (lVar8 = (long)HstPtrBegin % 8, lVar8 != 0)) {
          HstPtrBegin = (undefined8 *)((long)HstPtrBegin - lVar8);
          local_70 = local_70 + lVar8;
        }
        TgtPtrBegin = DeviceTy::getTgtPtrBegin
                                (Device,HstPtrBegin,local_70,&local_81,
                                 (bool)((byte)((uVar9 & 0x10) >> 4) | uVar3 < 0x1000000000000));
        uVar3 = local_78[uVar1];
        bVar5 = (byte)(((uint)uVar3 & 0x10) >> 4) | uVar3 < 0x1000000000000;
        bVar10 = ((byte)((uVar9 & 8) >> 3) | local_81) & bVar5;
        if (((uVar3 & 2) != 0) || (Device = local_80, bVar10 != 0)) {
          if ((uVar3 & 2) != 0) {
            if (bVar5 == 0) {
              local_50 = TgtPtrBegin;
              lVar8 = DeviceTy::getMapEntryRefCnt(local_80,local_60[(ushort)(uVar3 >> 0x30) - 1]);
              bVar12 = lVar8 == 1;
              TgtPtrBegin = local_50;
            }
            else {
              bVar12 = false;
            }
            if (((byte)((byte)(((uint)uVar3 & 4) >> 2) | bVar12 | bVar10) == 1) &&
               (iVar6 = DeviceTy::data_retrieve(local_80,HstPtrBegin,TgtPtrBegin,local_70),
               iVar6 != 0)) {
              return -1;
            }
          }
          iVar7 = pthread_mutex_lock(local_68);
          if (iVar7 != 0) {
            std::__throw_system_error(iVar7);
          }
          __position._M_node =
               (local_80->ShadowPtrMap)._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
          if (__position._M_node != local_58) {
            puVar2 = (undefined8 *)(local_70 + (long)HstPtrBegin);
            do {
              puVar4 = *(undefined8 **)(__position._M_node + 1);
              if (puVar4 < HstPtrBegin) {
LAB_001071f9:
                __position._M_node = (_Base_ptr)std::_Rb_tree_increment(__position._M_node);
              }
              else {
                if (puVar2 <= puVar4) break;
                if ((*(byte *)(local_78 + uVar1) & 2) != 0) {
                  *puVar4 = __position._M_node[1]._M_parent;
                }
                if (bVar10 == 0) goto LAB_001071f9;
                __position = std::
                             _Rb_tree<void*,std::pair<void*const,ShadowPtrValTy>,std::_Select1st<std::pair<void*const,ShadowPtrValTy>>,std::less<void*>,std::allocator<std::pair<void*const,ShadowPtrValTy>>>
                             ::erase_abi_cxx11_(local_38,__position);
              }
            } while (__position._M_node != local_58);
          }
          pthread_mutex_unlock(local_68);
          Device = local_80;
          if ((bVar10 != 0) &&
             (iVar7 = DeviceTy::deallocTgtPtr
                                (local_80,HstPtrBegin,local_70,SUB41((uVar9 & 8) >> 3,0)),
             Device = local_80, iVar7 != 0)) {
            return -1;
          }
        }
      }
      bVar12 = 1 < (long)uVar11;
      uVar11 = uVar1;
    } while (bVar12);
  }
  return 0;
}

Assistant:

int target_data_end(DeviceTy &Device, int32_t arg_num, void **args_base,
    void **args, int64_t *arg_sizes, int64_t *arg_types) {
  // process each input.
  for (int32_t i = arg_num - 1; i >= 0; --i) {
    // Ignore private variables and arrays - there is no mapping for them.
    // Also, ignore the use_device_ptr directive, it has no effect here.
    if ((arg_types[i] & OMP_TGT_MAPTYPE_LITERAL) ||
        (arg_types[i] & OMP_TGT_MAPTYPE_PRIVATE))
      continue;

    void *HstPtrBegin = args[i];
    int64_t data_size = arg_sizes[i];
    // Adjust for proper alignment if this is a combined entry (for structs).
    // Look at the next argument - if that is MEMBER_OF this one, then this one
    // is a combined entry.
    int64_t padding = 0;
    const int next_i = i+1;
    if (member_of(arg_types[i]) < 0 && next_i < arg_num &&
        member_of(arg_types[next_i]) == i) {
      padding = (int64_t)HstPtrBegin % alignment;
      if (padding) {
        DP("Using a padding of %" PRId64 " bytes for begin address " DPxMOD
            "\n", padding, DPxPTR(HstPtrBegin));
        HstPtrBegin = (char *) HstPtrBegin - padding;
        data_size += padding;
      }
    }

    bool IsLast;
    bool UpdateRef = !(arg_types[i] & OMP_TGT_MAPTYPE_MEMBER_OF) ||
        (arg_types[i] & OMP_TGT_MAPTYPE_PTR_AND_OBJ);
    bool ForceDelete = arg_types[i] & OMP_TGT_MAPTYPE_DELETE;

    // If PTR_AND_OBJ, HstPtrBegin is address of pointee
    void *TgtPtrBegin = Device.getTgtPtrBegin(HstPtrBegin, data_size, IsLast,
        UpdateRef);
    DP("There are %" PRId64 " bytes allocated at target address " DPxMOD
        " - is%s last\n", data_size, DPxPTR(TgtPtrBegin),
        (IsLast ? "" : " not"));

    bool DelEntry = IsLast || ForceDelete;

    if ((arg_types[i] & OMP_TGT_MAPTYPE_MEMBER_OF) &&
        !(arg_types[i] & OMP_TGT_MAPTYPE_PTR_AND_OBJ)) {
      DelEntry = false; // protect parent struct from being deallocated
    }

    if ((arg_types[i] & OMP_TGT_MAPTYPE_FROM) || DelEntry) {
      // Move data back to the host
      if (arg_types[i] & OMP_TGT_MAPTYPE_FROM) {
        bool Always = arg_types[i] & OMP_TGT_MAPTYPE_ALWAYS;
        bool CopyMember = false;
        if ((arg_types[i] & OMP_TGT_MAPTYPE_MEMBER_OF) &&
            !(arg_types[i] & OMP_TGT_MAPTYPE_PTR_AND_OBJ)) {
          // Copy data only if the "parent" struct has RefCount==1.
          int32_t parent_idx = member_of(arg_types[i]);
          long parent_rc = Device.getMapEntryRefCnt(args[parent_idx]);
          assert(parent_rc > 0 && "parent struct not found");
          if (parent_rc == 1) {
            CopyMember = true;
          }
        }

        if (DelEntry || Always || CopyMember) {
          DP("Moving %" PRId64 " bytes (tgt:" DPxMOD ") -> (hst:" DPxMOD ")\n",
              data_size, DPxPTR(TgtPtrBegin), DPxPTR(HstPtrBegin));
          int rt = Device.data_retrieve(HstPtrBegin, TgtPtrBegin, data_size);
          if (rt != OFFLOAD_SUCCESS) {
            DP("Copying data from device failed.\n");
            return OFFLOAD_FAIL;
          }
        }
      }

      // If we copied back to the host a struct/array containing pointers, we
      // need to restore the original host pointer values from their shadow
      // copies. If the struct is going to be deallocated, remove any remaining
      // shadow pointer entries for this struct.
      uintptr_t lb = (uintptr_t) HstPtrBegin;
      uintptr_t ub = (uintptr_t) HstPtrBegin + data_size;
      Device.ShadowMtx.lock();
      for (ShadowPtrListTy::iterator it = Device.ShadowPtrMap.begin();
           it != Device.ShadowPtrMap.end();) {
        void **ShadowHstPtrAddr = (void**) it->first;

        // An STL map is sorted on its keys; use this property
        // to quickly determine when to break out of the loop.
        if ((uintptr_t) ShadowHstPtrAddr < lb) {
          ++it;
          continue;
        }
        if ((uintptr_t) ShadowHstPtrAddr >= ub)
          break;

        // If we copied the struct to the host, we need to restore the pointer.
        if (arg_types[i] & OMP_TGT_MAPTYPE_FROM) {
          DP("Restoring original host pointer value " DPxMOD " for host "
              "pointer " DPxMOD "\n", DPxPTR(it->second.HstPtrVal),
              DPxPTR(ShadowHstPtrAddr));
          *ShadowHstPtrAddr = it->second.HstPtrVal;
        }
        // If the struct is to be deallocated, remove the shadow entry.
        if (DelEntry) {
          DP("Removing shadow pointer " DPxMOD "\n", DPxPTR(ShadowHstPtrAddr));
          it = Device.ShadowPtrMap.erase(it);
        } else {
          ++it;
        }
      }
      Device.ShadowMtx.unlock();

      // Deallocate map
      if (DelEntry) {
        int rt = Device.deallocTgtPtr(HstPtrBegin, data_size, ForceDelete);
        if (rt != OFFLOAD_SUCCESS) {
          DP("Deallocating data from device failed.\n");
          return OFFLOAD_FAIL;
        }
      }
    }
  }

  return OFFLOAD_SUCCESS;
}